

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgcvn(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **nulval,void **array,int *anynul,int *status)

{
  long *__ptr;
  int *local_990;
  int *local_958;
  char local_918 [8];
  char errmsg [100];
  char *array1;
  LONGLONG nelem1;
  int icol_1;
  LONGLONG width;
  LONGLONG repeat;
  int typecode;
  int icol;
  size_t sizes [255];
  LONGLONG *repeats;
  long nrowbuf;
  LONGLONG currow;
  LONGLONG nread;
  LONGLONG ndone;
  LONGLONG ntotrows;
  LONGLONG nrows_local;
  LONGLONG firstrow_local;
  int *colnum_local;
  int *datatype_local;
  fitsfile *pfStack_20;
  int ncols_local;
  fitsfile *fptr_local;
  
  ntotrows = nrows;
  nrows_local = firstrow;
  firstrow_local = (LONGLONG)colnum;
  colnum_local = datatype;
  datatype_local._4_4_ = ncols;
  pfStack_20 = fptr;
  memset(&typecode,0,0x7f8);
  sizes[0xd] = 1;
  sizes[0xb] = 1;
  sizes[10] = 1;
  sizes[0x14] = 2;
  sizes[0x13] = 2;
  sizes[0x1d] = 4;
  sizes[0x1e] = 4;
  sizes[0x27] = 8;
  sizes[0x28] = 8;
  sizes[0x4f] = 8;
  sizes[0x50] = 8;
  sizes[0x29] = 4;
  sizes[0x51] = 8;
  sizes[0xa2] = 0x10;
  if (*status < 1) {
    if (datatype_local._4_4_ < 1) {
      *status = 0;
      fptr_local._4_4_ = 0;
    }
    else {
      __ptr = (long *)malloc((long)datatype_local._4_4_ << 3);
      if (__ptr == (long *)0x0) {
        *status = 0x71;
        fptr_local._4_4_ = 0x71;
      }
      else {
        ffgnrwll(pfStack_20,&ndone,status);
        ffgrsz(pfStack_20,(long *)&repeats,status);
        for (repeat._4_4_ = 0; repeat._4_4_ < datatype_local._4_4_ && repeat._4_4_ < 1000;
            repeat._4_4_ = repeat._4_4_ + 1) {
          ffgtclll(pfStack_20,*(int *)(firstrow_local + (long)repeat._4_4_ * 4),(int *)&repeat,
                   &width,(LONGLONG *)&stack0xfffffffffffff770,status);
          __ptr[repeat._4_4_] = width;
          if (((colnum_local[repeat._4_4_] == 1) || (colnum_local[repeat._4_4_] == 0x10)) ||
             (*(long *)(&typecode + (long)colnum_local[repeat._4_4_] * 2) == 0)) {
            ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
            *status = 0x19a;
          }
          if ((int)repeat < 0) {
            ffpmsg("Cannot read from variable-length data (ffgcvn)");
            *status = 0x140;
          }
          if (*status != 0) break;
        }
        if (*status == 0) {
          if (datatype_local._4_4_ == 1) {
            if (anynul == (int *)0x0) {
              local_958 = (int *)0x0;
            }
            else {
              local_958 = anynul;
            }
            ffgcv(pfStack_20,*colnum_local,*(int *)firstrow_local,nrows_local,1,ntotrows * *__ptr,
                  *nulval,*array,local_958,status);
            free(__ptr);
            fptr_local._4_4_ = *status;
          }
          else {
            nrowbuf = nrows_local;
            for (nread = 0; nread < ntotrows; nread = currow + nread) {
              currow = ntotrows - nread;
              if ((long)repeats < ntotrows - nread) {
                currow = (LONGLONG)repeats;
              }
              for (nelem1._4_4_ = 0; nelem1._4_4_ < datatype_local._4_4_;
                  nelem1._4_4_ = nelem1._4_4_ + 1) {
                if (anynul == (int *)0x0) {
                  local_990 = (int *)0x0;
                }
                else {
                  local_990 = anynul + nelem1._4_4_;
                }
                ffgcv(pfStack_20,colnum_local[nelem1._4_4_],
                      *(int *)(firstrow_local + (long)nelem1._4_4_ * 4),nrowbuf,1,
                      currow * __ptr[nelem1._4_4_],nulval[nelem1._4_4_],
                      (void *)((long)array[nelem1._4_4_] +
                              __ptr[nelem1._4_4_] * nread *
                              *(long *)(&typecode + (long)colnum_local[nelem1._4_4_] * 2)),local_990
                      ,status);
                if (*status != 0) {
                  sprintf(local_918,"Failed to read column %d data rows %lld-%lld (ffgcvn)",
                          (ulong)*(uint *)(firstrow_local + (long)nelem1._4_4_ * 4),nrowbuf,
                          nrowbuf + currow + -1);
                  ffpmsg(local_918);
                  break;
                }
              }
              if (*status != 0) break;
              nrowbuf = currow + nrowbuf;
            }
            free(__ptr);
            fptr_local._4_4_ = *status;
          }
        }
        else {
          free(__ptr);
          fptr_local._4_4_ = *status;
        }
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcvn( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to read               */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to read (1 = 1st col)   */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)     */
            LONGLONG nrows,       /* I - number of rows to read              */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            void **array,     /* O - array of pointers to values that are returned    */
            int  *anynul,     /* O - anynul[i] set to 1 if any values in column i are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read arrays of values from NCOLS table columns. This is an optimization
  to read all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements for column i will be set equal to *(nulval[i]), unless nulval[i]=0
  in which case no checking for undefined values will be performed.
  anynul[i] is returned with a value of true if any pixels in column i are undefined.
*/
{
    LONGLONG ntotrows, ndone, nread, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot read from variable-length data (ffgcvn)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_read_col(fptr, datatype[0], colnum[0], firstrow, 1,
		    nrows*repeats[0], nulval[0], 
		    array[0], anynul ? &(anynul[0]) : 0, status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nread = (nrows-ndone);  /* Number of rows to read (not elements) */
      if (nread > nrowbuf) nread = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nread*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_read_col(fptr, datatype[icol], colnum[icol], currow, 1, 
		      nelem1, nulval[icol], array1, 
		      (anynul ? &(anynul[icol]) : 0), status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg, 
		  "Failed to read column %d data rows %lld-%lld (ffgcvn)",
		  colnum[icol], currow, currow+nread-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nread;
      ndone += nread;
    }

    free(repeats);
    return *status;
}